

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

uint32_t __thiscall jpgd::jpeg_decoder::H2V2ConvertFiltered(jpeg_decoder *this)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint8 *puVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint8 *puVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint8 *puVar25;
  ulong uVar26;
  char *__assertion;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  uint8 *puVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  uint8 *puVar42;
  uint8 *puVar43;
  uint uVar44;
  uint local_98;
  
  uVar21 = this->m_image_y_size - this->m_total_lines_left;
  uVar14 = uVar21 & 0xf;
  uVar31 = (this->m_image_y_size >> 1) - 1;
  puVar42 = this->m_pScan_line_0;
  iVar28 = (int)(uVar21 - 1) >> 1;
  if ((int)(iVar28 + 1U) < (int)uVar31) {
    uVar31 = iVar28 + 1U;
  }
  puVar20 = this->m_pSample_buf;
  puVar25 = puVar20;
  puVar36 = puVar20;
  if ((-1 < iVar28) && (((uVar14 == 0xf || (uVar14 == 0)) && (1 < this->m_total_lines_left)))) {
    if ((int)uVar21 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73c,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (this->m_sample_buf_prev_valid == false) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73d,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    puVar25 = this->m_pSample_buf_prev;
    if (uVar14 == 0xf) {
      puVar36 = puVar25;
    }
  }
  uVar2 = (uVar21 & 8) * 0x10 + (uVar21 & 7) * 8;
  uVar24 = iVar28 * 8 & 0x38U | 0x100;
  uVar32 = (uVar31 & 7) << 3 | 0x100;
  uVar31 = (this->m_image_x_size >> 1) - 1;
  if ((uVar14 == 0) || (uVar14 == 0xf)) {
    uVar15 = 1;
    if (0 < this->m_image_x_size) {
      lVar1 = (ulong)(uVar21 & 1) * 8;
      uVar14 = 0;
      uVar33 = 0;
      do {
        uVar23 = (uint)uVar33;
        uVar34 = (uVar23 & 7 | uVar14 & 0x40 | uVar2) + ((uint)(uVar33 >> 4) & 0xfffffff) * 0x180;
        if ((int)uVar34 < 0) goto LAB_001da607;
        iVar28 = this->m_max_blocks_per_row * 0x40;
        if (iVar28 <= (int)uVar34) goto LAB_001da5fe;
        uVar16 = (int)(uVar23 - 1) >> 1;
        uVar17 = uVar16 + 1;
        if ((int)uVar31 <= (int)(uVar16 + 1)) {
          uVar17 = uVar31;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        uVar16 = uVar16 & 7 | (uVar16 & 0xffffff8) * 0x30;
        uVar22 = uVar16 + uVar24;
        if ((int)uVar22 < 0) goto LAB_001da607;
        if (iVar28 <= (int)uVar22) goto LAB_001da5fe;
        uVar38 = (ulong)uVar22 | 0x40;
        if (iVar28 <= (int)uVar38) goto LAB_001da5fe;
        uVar16 = uVar16 + uVar32;
        if ((int)uVar16 < 0) goto LAB_001da607;
        if (iVar28 <= (int)uVar16) goto LAB_001da5fe;
        uVar41 = (ulong)uVar16 | 0x40;
        if (iVar28 <= (int)uVar41) goto LAB_001da5fe;
        uVar44 = uVar17 & 7 | (uVar17 & 0xffffff8) * 0x30;
        uVar17 = uVar44 + uVar24;
        if ((int)uVar17 < 0) goto LAB_001da607;
        if (iVar28 <= (int)uVar17) goto LAB_001da5fe;
        uVar19 = (ulong)uVar17 | 0x40;
        if (iVar28 <= (int)uVar19) goto LAB_001da5fe;
        uVar44 = uVar44 + uVar32;
        if ((int)uVar44 < 0) goto LAB_001da607;
        if (iVar28 <= (int)uVar44) goto LAB_001da5fe;
        uVar26 = (ulong)uVar44 | 0x40;
        if (iVar28 <= (int)uVar26) goto LAB_001da5fe;
        bVar3 = puVar36[uVar34];
        puVar20 = this->m_pSample_buf;
        uVar39 = (ulong)(uVar23 & 1);
        uVar23 = (uint)H2V2ConvertFiltered::s_muls[uVar21 & 1][uVar39][0];
        uVar29 = (uint)*(byte *)(lVar1 + 0x21caf1 + uVar39 * 4);
        uVar30 = (uint)*(byte *)(lVar1 + 0x21caf2 + uVar39 * 4);
        uVar27 = (uint)*(byte *)(lVar1 + 0x21caf3 + uVar39 * 4);
        uVar34 = puVar20[uVar26] * uVar27 +
                 puVar25[uVar19] * uVar30 + puVar20[uVar41] * uVar29 + puVar25[uVar38] * uVar23 + 8
                 >> 4;
        iVar28 = this->m_crr[uVar34] + (uint)bVar3;
        if (iVar28 < 1) {
          iVar28 = 0;
        }
        if (0xfe < iVar28) {
          iVar28 = 0xff;
        }
        uVar23 = uVar27 * puVar20[uVar44] +
                 uVar30 * puVar25[uVar17] + uVar29 * puVar20[uVar16] + uVar23 * puVar25[uVar22] + 8
                 >> 4;
        iVar18 = (this->m_cbg[uVar23] + this->m_crg[uVar34] >> 0x10) + (uint)bVar3;
        iVar35 = (uint)bVar3 + this->m_cbb[uVar23];
        puVar42[uVar33 * 4] = (uint8)iVar28;
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        puVar42[uVar33 * 4 + 1] = (uint8)iVar18;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0xfe < iVar35) {
          iVar35 = 0xff;
        }
        puVar42[uVar33 * 4 + 2] = (uint8)iVar35;
        puVar42[uVar33 * 4 + 3] = 0xff;
        uVar33 = uVar33 + 1;
        uVar14 = uVar14 + 8;
      } while ((int)uVar33 < this->m_image_x_size);
      uVar15 = 1;
    }
  }
  else {
    if ((uVar21 & 1) == 0) {
      __assert_fail("(row & 1) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x753,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((int)uVar21 >> 1 != iVar28) {
      __assert_fail("((y + 1 - 1) >> 1) == c_y0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x754,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar36 != puVar20) {
      __assert_fail("p_YSamples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x756,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar25 != puVar20) {
      __assert_fail("p_C0Samples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x757,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (0 < this->m_image_x_size) {
      iVar28 = (uVar14 + 1 & 8) * 0x10 + (uVar14 + 1 & 6) * 8;
      puVar20 = this->m_pScan_line_1;
      uVar14 = 0;
      do {
        uVar23 = uVar14 & 7 | uVar14 * 8 & 0x40 | (uVar14 * 8 & 0xffffff80) * 3;
        uVar21 = uVar23 + uVar2;
        if ((int)uVar21 < 0) goto LAB_001da607;
        iVar18 = this->m_max_blocks_per_row * 0x40;
        if (iVar18 <= (int)uVar21) goto LAB_001da5fe;
        uVar23 = uVar23 + iVar28;
        if ((int)uVar23 < 0) goto LAB_001da607;
        if (iVar18 <= (int)uVar23) goto LAB_001da5fe;
        uVar17 = (int)(uVar14 - 1) >> 1;
        uVar34 = uVar17 + 1;
        if ((int)uVar31 <= (int)(uVar17 + 1)) {
          uVar34 = uVar31;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        uVar16 = uVar17 & 7 | (uVar17 & 0xffffff8) * 0x30;
        uVar22 = uVar16 + uVar24;
        if ((int)uVar22 < 0) goto LAB_001da607;
        if (iVar18 <= (int)uVar22) goto LAB_001da5fe;
        uVar33 = (ulong)uVar22 | 0x40;
        if (iVar18 <= (int)uVar33) goto LAB_001da5fe;
        uVar16 = uVar16 + uVar32;
        if ((int)uVar16 < 0) goto LAB_001da607;
        if (iVar18 <= (int)uVar16) goto LAB_001da5fe;
        uVar38 = (ulong)uVar16 | 0x40;
        if (iVar18 <= (int)uVar38) goto LAB_001da5fe;
        uVar44 = uVar34 & 7 | (uVar34 & 0xffffff8) * 0x30;
        uVar34 = uVar44 + uVar24;
        if ((int)uVar34 < 0) goto LAB_001da607;
        if (iVar18 <= (int)uVar34) goto LAB_001da5fe;
        uVar41 = (ulong)uVar34 | 0x40;
        if (iVar18 <= (int)uVar41) goto LAB_001da5fe;
        uVar44 = uVar44 + uVar32;
        if ((int)uVar44 < 0) goto LAB_001da607;
        if (iVar18 <= (int)uVar44) goto LAB_001da5fe;
        uVar19 = (ulong)uVar44 | 0x40;
        if (iVar18 <= (int)uVar19) goto LAB_001da5fe;
        bVar3 = puVar36[uVar21];
        bVar4 = puVar25[uVar33];
        puVar43 = this->m_pSample_buf;
        bVar5 = puVar25[uVar41];
        bVar6 = puVar43[uVar19];
        uVar37 = uVar14 & 1;
        bVar7 = H2V2ConvertFiltered::s_muls[1][uVar37][1];
        bVar8 = H2V2ConvertFiltered::s_muls[1][uVar37][2];
        bVar9 = H2V2ConvertFiltered::s_muls[1][uVar37][3];
        uVar21 = (uint)H2V2ConvertFiltered::s_muls[1][uVar37][0];
        uVar29 = (uint)puVar43[uVar38];
        uVar30 = (uint)bVar6;
        uVar27 = bVar9 * uVar30 + (uint)bVar8 * (uint)bVar5 + bVar7 * uVar29 + uVar21 * bVar4 + 8 >>
                 4;
        iVar18 = this->m_crr[uVar27] + (uint)bVar3;
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        bVar10 = puVar43[uVar44];
        bVar11 = puVar25[uVar22];
        uVar16 = (uint)puVar43[uVar16];
        bVar12 = puVar25[uVar34];
        uVar21 = (uint)bVar9 * (uint)bVar10 +
                 (uint)bVar8 * (uint)bVar12 + bVar7 * uVar16 + uVar21 * bVar11 + 8 >> 4;
        iVar35 = (this->m_cbg[uVar21] + this->m_crg[uVar27] >> 0x10) + (uint)bVar3;
        iVar40 = (uint)bVar3 + this->m_cbb[uVar21];
        bVar3 = puVar36[uVar23];
        *puVar42 = (uint8)iVar18;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0xfe < iVar35) {
          iVar35 = 0xff;
        }
        puVar42[1] = (uint8)iVar35;
        if (iVar40 < 1) {
          iVar40 = 0;
        }
        if (0xfe < iVar40) {
          iVar40 = 0xff;
        }
        puVar42[2] = (uint8)iVar40;
        puVar42[3] = 0xff;
        bVar7 = H2V2ConvertFiltered::s_muls[0][uVar37][0];
        uVar21 = (uint)H2V2ConvertFiltered::s_muls[0][uVar37][1];
        bVar8 = H2V2ConvertFiltered::s_muls[0][uVar37][2];
        uVar34 = (uint)H2V2ConvertFiltered::s_muls[0][uVar37][3];
        uVar22 = (uint)bVar4;
        local_98 = (uint)bVar5;
        uVar23 = uVar34 * uVar30 + bVar8 * local_98 + uVar21 * uVar29 + bVar7 * uVar22 + 8 >> 4;
        uVar21 = (uint)bVar8 * (uint)bVar12 + uVar21 * uVar16 + (uint)bVar7 * (uint)bVar11 +
                 uVar34 * bVar10 + 8 >> 4;
        iVar18 = this->m_crr[uVar23] + (uint)bVar3;
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        iVar35 = (this->m_cbg[uVar21] + this->m_crg[uVar23] >> 0x10) + (uint)bVar3;
        iVar40 = (uint)bVar3 + this->m_cbb[uVar21];
        *puVar20 = (uint8)iVar18;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0xfe < iVar35) {
          iVar35 = 0xff;
        }
        puVar20[1] = (uint8)iVar35;
        if (iVar40 < 1) {
          iVar40 = 0;
        }
        if (0xfe < iVar40) {
          iVar40 = 0xff;
        }
        puVar43 = puVar42 + 4;
        puVar20[2] = (uint8)iVar40;
        puVar20[3] = 0xff;
        puVar13 = puVar20 + 4;
        if (((uVar14 & 1) != 0) && ((int)uVar14 < this->m_image_x_size + -1)) {
          if (uVar17 != (int)uVar14 >> 1) {
            __assert_fail("c_x0 == (nx - 1) >> 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                          ,0x799,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
          }
          uVar21 = uVar14 * 8 + 8;
          uVar23 = uVar14 + 1 & 6 | uVar21 & 0x40 | (uVar21 & 0xffffff80) * 3;
          uVar21 = uVar23 + uVar2;
          if ((int)uVar21 < 0) goto LAB_001da607;
          iVar18 = this->m_max_blocks_per_row * 0x40;
          if (iVar18 <= (int)uVar21) goto LAB_001da5fe;
          uVar23 = uVar23 + iVar28;
          if ((int)uVar23 < 0) goto LAB_001da607;
          if (iVar18 <= (int)uVar23) goto LAB_001da5fe;
          bVar3 = puVar36[uVar21];
          uVar33 = (ulong)((uint)bVar5 * 9 + uVar29 + (uVar30 + uVar22) * 3 + 8 >> 2 & 0xffc);
          iVar18 = *(int *)((long)this->m_crr + uVar33) + (uint)bVar3;
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          if (0xfe < iVar18) {
            iVar18 = 0xff;
          }
          bVar4 = puVar36[uVar23];
          uVar38 = (ulong)(((uint)bVar10 + (uint)bVar11) * 3 +
                           (uint)bVar12 + (uint)bVar12 * 8 + uVar16 + 8 >> 2 & 0xffc);
          iVar35 = (*(int *)((long)this->m_cbg + uVar38) + *(int *)((long)this->m_crg + uVar33) >>
                   0x10) + (uint)bVar3;
          iVar40 = (uint)bVar3 + *(int *)((long)this->m_cbb + uVar38);
          puVar42[4] = (uint8)iVar18;
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          if (0xfe < iVar35) {
            iVar35 = 0xff;
          }
          puVar42[5] = (uint8)iVar35;
          if (iVar40 < 1) {
            iVar40 = 0;
          }
          if (0xfe < iVar40) {
            iVar40 = 0xff;
          }
          puVar42[6] = (uint8)iVar40;
          puVar42[7] = 0xff;
          uVar38 = (ulong)(uVar22 + (bVar5 + uVar29) * 3 + (uint)bVar6 * 9 + 8 >> 2 & 0x7fc);
          uVar33 = (ulong)((uint)bVar10 + (uint)bVar10 * 8 + (uint)bVar11 + (bVar12 + uVar16) * 3 +
                           8 >> 2 & 0x7fc);
          iVar18 = *(int *)((long)this->m_crr + uVar38) + (uint)bVar4;
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          if (0xfe < iVar18) {
            iVar18 = 0xff;
          }
          iVar35 = (*(int *)((long)this->m_cbg + uVar33) + *(int *)((long)this->m_crg + uVar38) >>
                   0x10) + (uint)bVar4;
          iVar40 = (uint)bVar4 + *(int *)((long)this->m_cbb + uVar33);
          puVar20[4] = (uint8)iVar18;
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          if (0xfe < iVar35) {
            iVar35 = 0xff;
          }
          puVar20[5] = (uint8)iVar35;
          if (iVar40 < 1) {
            iVar40 = 0;
          }
          if (0xfe < iVar40) {
            iVar40 = 0xff;
          }
          puVar43 = puVar42 + 8;
          puVar20[6] = (uint8)iVar40;
          puVar20[7] = 0xff;
          puVar13 = puVar20 + 8;
          uVar14 = uVar14 + 1;
        }
        puVar20 = puVar13;
        uVar14 = uVar14 + 1;
        puVar42 = puVar43;
      } while ((int)uVar14 < this->m_image_x_size);
    }
    uVar15 = 2;
  }
  return uVar15;
LAB_001da607:
  __assertion = "ofs >= 0";
  goto LAB_001da60e;
LAB_001da5fe:
  __assertion = "ofs < m_max_blocks_per_row * 64";
LAB_001da60e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.h"
                ,0x113,"int jpgd::jpeg_decoder::check_sample_buf_ofs(int) const");
}

Assistant:

uint32_t jpeg_decoder::H2V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 6;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 128 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 256;
		const int y1_base = (c_y1 & 7) * 8 + 256;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;

		static const uint8_t s_muls[2][2][4] =
		{
			{ { 1, 3, 3, 9 }, { 3, 9, 1, 3 }, },
			{ { 3, 1, 9, 3 }, { 9, 3, 3, 1 } }
		};

		if (((row & 15) >= 1) && ((row & 15) <= 14))
		{
			assert((row & 1) == 1);
			assert(((y + 1 - 1) >> 1) == c_y0);

			assert(p_YSamples == m_pSample_buf);
			assert(p_C0Samples == m_pSample_buf);

			uint8* d1 = m_pScan_line_1;
			const int y_sample_base_ofs1 = (((row + 1) & 8) ? 128 : 0) + ((row + 1) & 7) * 8;

			for (int x = 0; x < m_image_x_size; x++)
			{
				int k = (x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7);
				int y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
				int y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				{
					const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d0[0] = clamp(y_sample0 + rc);
					d0[1] = clamp(y_sample0 + gc);
					d0[2] = clamp(y_sample0 + bc);
					d0[3] = 255;

					d0 += 4;
				}

				{
					const uint8_t* pMuls = &s_muls[(row + 1) & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d1[0] = clamp(y_sample1 + rc);
					d1[1] = clamp(y_sample1 + gc);
					d1[2] = clamp(y_sample1 + bc);
					d1[3] = 255;

					d1 += 4;
				}

				if (((x & 1) == 1) && (x < m_image_x_size - 1))
				{
					const int nx = x + 1;
					assert(c_x0 == (nx - 1) >> 1);

					k = (nx >> 4) * BLOCKS_PER_MCU * 64 + ((nx & 8) ? 64 : 0) + (nx & 7);
					y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
					y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

					{
						const uint8_t* pMuls = &s_muls[row & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d0[0] = clamp(y_sample0 + rc);
						d0[1] = clamp(y_sample0 + gc);
						d0[2] = clamp(y_sample0 + bc);
						d0[3] = 255;

						d0 += 4;
					}

					{
						const uint8_t* pMuls = &s_muls[(row + 1) & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d1[0] = clamp(y_sample1 + rc);
						d1[1] = clamp(y_sample1 + gc);
						d1[2] = clamp(y_sample1 + bc);
						d1[3] = 255;

						d1 += 4;
					}

					++x;
				}
			}

			return 2;
		}
		else
		{
			for (int x = 0; x < m_image_x_size; x++)
			{
				int y_sample = p_YSamples[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + y_sample_base_ofs)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
				int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
				int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				d0[0] = clamp(y_sample + rc);
				d0[1] = clamp(y_sample + gc);
				d0[2] = clamp(y_sample + bc);
				d0[3] = 255;

				d0 += 4;
			}

			return 1;
		}
	}